

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O3

_Bool xdr_string_decode(XDR *xdrs,char **cpp,u_int maxsize)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  _Bool _Var4;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  uint32_t size;
  uint local_30;
  char local_2c [4];
  
  pcVar5 = *cpp;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_tail < puVar1) {
    _Var4 = (*xdrs->x_ops->x_getunit)(xdrs,&local_30);
    if (!_Var4) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR size","xdr_string_decode",0x3a7);
      return false;
    }
  }
  else {
    uVar2 = *(uint *)xdrs->x_data;
    local_30 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  if (9000 < local_30) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
      return false;
    }
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR size %u > max %u","xdr_string_decode",0x3ae,(ulong)local_30,9000);
    return false;
  }
  uVar2 = local_30 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)(*__ntirpc_pkg_params.malloc_)
                               ((ulong)uVar2,
                                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/ntirpc/rpc/xdr_inline.h"
                                ,0x3c1,"xdr_string_decode");
  }
  uVar3 = local_30;
  if (local_30 == 0) {
LAB_001195f7:
    pcVar5[local_30] = '\0';
    *cpp = pcVar5;
    return true;
  }
  _Var4 = (*xdrs->x_ops->x_getbytes)(xdrs,pcVar5,local_30);
  if (_Var4) {
    if (((uVar3 & 3) == 0) ||
       (_Var4 = (*xdrs->x_ops->x_getbytes)(xdrs,local_2c,4 - (uVar3 & 3)), _Var4))
    goto LAB_001195f7;
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00119673;
    pcVar7 = "%s:%u ERROR crud";
    uVar6 = 0x1c9;
  }
  else {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) goto LAB_00119673;
    pcVar7 = "%s:%u ERROR opaque";
    uVar6 = 0x1b9;
  }
  (*__ntirpc_pkg_params.warnx_)(pcVar7,"xdr_opaque_decode",uVar6);
LAB_00119673:
  (*__ntirpc_pkg_params.free_size_)(pcVar5,(ulong)uVar2);
  return false;
}

Assistant:

static inline bool
xdr_string_decode(XDR *xdrs, char **cpp, u_int maxsize)
{
	char *sp = *cpp;	/* sp is the actual string pointer */
	uint32_t size;
	u_int nodesize;
	bool ret;

	/*
	 * first deal with the length since xdr strings are counted-strings
	 */
	if (!XDR_GETUINT32(xdrs, &size)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size",
			__func__, __LINE__);
		return (false);
	}

	if (size > maxsize) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size %" PRIu32 " > max %u",
			__func__, __LINE__,
			size, maxsize);
		return (false);
	}

	nodesize = (uint32_t)(size + 1);
	if (nodesize < (size + 1)) {
		/* caller provided very large maxsize */
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR overflow %" PRIu32,
			__func__, __LINE__,
			size);
		return (false);
	}

	/*
	 * now deal with the actual bytes
	 */
	if (!sp)
		sp = (char *)mem_alloc(nodesize);

	ret = xdr_opaque_decode(xdrs, sp, size);
	if (!ret) {
		mem_free(sp, nodesize);
		return (ret);
	}
	sp[size] = '\0';
	*cpp = sp;			/* only valid pointer */
	return (ret);
}